

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UAFundamentalParameter.cpp
# Opt level: O1

void __thiscall
DIS::UAFundamentalParameter::marshal(UAFundamentalParameter *this,DataStream *dataStream)

{
  DataStream::operator<<(dataStream,this->_activeEmissionParameterIndex);
  DataStream::operator<<(dataStream,this->_scanPattern);
  DataStream::operator<<(dataStream,this->_beamCenterAzimuthHorizontal);
  DataStream::operator<<(dataStream,this->_azimuthalBeamwidthHorizontal);
  DataStream::operator<<(dataStream,this->_beamCenterDepressionElevation);
  DataStream::operator<<(dataStream,this->_beamwidthDownElevation);
  return;
}

Assistant:

void UAFundamentalParameter::marshal(DataStream& dataStream) const
{
    dataStream << _activeEmissionParameterIndex;
    dataStream << _scanPattern;
    dataStream << _beamCenterAzimuthHorizontal;
    dataStream << _azimuthalBeamwidthHorizontal;
    dataStream << _beamCenterDepressionElevation;
    dataStream << _beamwidthDownElevation;
}